

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlRelaxNGPtr xmlRelaxNGParseDocument(xmlRelaxNGParserCtxtPtr ctxt,xmlNodePtr node)

{
  xmlChar *pxVar1;
  xmlRelaxNGGrammarPtr_conflict pxVar2;
  int iVar3;
  xmlRelaxNGGrammarPtr_conflict pxVar4;
  bool bVar5;
  xmlRelaxNGGrammarPtr_conflict ret;
  xmlRelaxNGGrammarPtr_conflict tmp;
  xmlRelaxNGGrammarPtr_conflict old;
  xmlChar *olddefine;
  xmlRelaxNGPtr schema;
  xmlNodePtr node_local;
  xmlRelaxNGParserCtxtPtr ctxt_local;
  
  if ((ctxt == (xmlRelaxNGParserCtxtPtr)0x0) || (node == (xmlNodePtr)0x0)) {
    ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
  }
  else {
    ctxt_local = (xmlRelaxNGParserCtxtPtr)xmlRelaxNGNewRelaxNG(ctxt);
    if (ctxt_local == (xmlRelaxNGParserCtxtPtr)0x0) {
      ctxt_local = (xmlRelaxNGParserCtxtPtr)0x0;
    }
    else {
      pxVar1 = ctxt->define;
      ctxt->define = (xmlChar *)0x0;
      if ((((node == (xmlNodePtr)0x0) || (node->ns == (xmlNs *)0x0)) ||
          (node->type != XML_ELEMENT_NODE)) ||
         ((iVar3 = xmlStrEqual(node->name,"grammar"), iVar3 == 0 ||
          (iVar3 = xmlStrEqual(node->ns->href,xmlRelaxNGNs), iVar3 == 0)))) {
        pxVar4 = xmlRelaxNGNewGrammar(ctxt);
        ctxt_local->error = (xmlRelaxNGValidityErrorFunc)pxVar4;
        if ((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error == (xmlRelaxNGGrammarPtr_conflict)0x0)
        {
          xmlRelaxNGFree((xmlRelaxNGPtr)ctxt_local);
          return (xmlRelaxNGPtr)0x0;
        }
        pxVar4->parent = ctxt->grammar;
        if (ctxt->grammar != (xmlRelaxNGGrammarPtr_conflict)0x0) {
          ret = ctxt->grammar->children;
          if (ret == (xmlRelaxNGGrammarPtr)0x0) {
            ctxt->grammar->children = pxVar4;
          }
          else {
            for (; ret->next != (xmlRelaxNGGrammarPtr)0x0; ret = ret->next) {
            }
            ret->next = pxVar4;
          }
        }
        pxVar2 = ctxt->grammar;
        ctxt->grammar = pxVar4;
        xmlRelaxNGParseStart(ctxt,node);
        if (pxVar2 != (xmlRelaxNGGrammarPtr_conflict)0x0) {
          ctxt->grammar = pxVar2;
        }
      }
      else {
        pxVar4 = xmlRelaxNGParseGrammar(ctxt,node->children);
        ctxt_local->error = (xmlRelaxNGValidityErrorFunc)pxVar4;
        if ((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error == (xmlRelaxNGGrammarPtr_conflict)0x0)
        {
          xmlRelaxNGFree((xmlRelaxNGPtr)ctxt_local);
          return (xmlRelaxNGPtr)0x0;
        }
      }
      ctxt->define = pxVar1;
      if ((((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start !=
           (xmlRelaxNGDefinePtr_conflict)0x0) &&
         (xmlRelaxNGCheckCycles(ctxt,((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start,0),
         (ctxt->flags & 0x80U) == 0)) {
        xmlRelaxNGSimplify(ctxt,((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start,
                           (xmlRelaxNGDefinePtr_conflict)0x0);
        while( true ) {
          bVar5 = false;
          if ((((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start !=
               (xmlRelaxNGDefinePtr_conflict)0x0) &&
             (bVar5 = false,
             ((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start->type == XML_RELAXNG_NOOP)) {
            bVar5 = ((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start->next !=
                    (xmlRelaxNGDefinePtr)0x0;
          }
          if (!bVar5) break;
          ((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start =
               ((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start->content;
        }
        xmlRelaxNGCheckRules
                  (ctxt,((xmlRelaxNGGrammarPtr_conflict)ctxt_local->error)->start,0x10,
                   XML_RELAXNG_NOOP);
      }
    }
  }
  return (xmlRelaxNGPtr)ctxt_local;
}

Assistant:

static xmlRelaxNGPtr
xmlRelaxNGParseDocument(xmlRelaxNGParserCtxtPtr ctxt, xmlNodePtr node)
{
    xmlRelaxNGPtr schema = NULL;
    const xmlChar *olddefine;
    xmlRelaxNGGrammarPtr old;

    if ((ctxt == NULL) || (node == NULL))
        return (NULL);

    schema = xmlRelaxNGNewRelaxNG(ctxt);
    if (schema == NULL)
        return (NULL);

    olddefine = ctxt->define;
    ctxt->define = NULL;
    if (IS_RELAXNG(node, "grammar")) {
        schema->topgrammar = xmlRelaxNGParseGrammar(ctxt, node->children);
        if (schema->topgrammar == NULL) {
            xmlRelaxNGFree(schema);
            return (NULL);
        }
    } else {
        xmlRelaxNGGrammarPtr tmp, ret;

        schema->topgrammar = ret = xmlRelaxNGNewGrammar(ctxt);
        if (schema->topgrammar == NULL) {
            xmlRelaxNGFree(schema);
            return (NULL);
        }
        /*
         * Link the new grammar in the tree
         */
        ret->parent = ctxt->grammar;
        if (ctxt->grammar != NULL) {
            tmp = ctxt->grammar->children;
            if (tmp == NULL) {
                ctxt->grammar->children = ret;
            } else {
                while (tmp->next != NULL)
                    tmp = tmp->next;
                tmp->next = ret;
            }
        }
        old = ctxt->grammar;
        ctxt->grammar = ret;
        xmlRelaxNGParseStart(ctxt, node);
        if (old != NULL)
            ctxt->grammar = old;
    }
    ctxt->define = olddefine;
    if (schema->topgrammar->start != NULL) {
        xmlRelaxNGCheckCycles(ctxt, schema->topgrammar->start, 0);
        if ((ctxt->flags & XML_RELAXNG_IN_EXTERNALREF) == 0) {
            xmlRelaxNGSimplify(ctxt, schema->topgrammar->start, NULL);
            while ((schema->topgrammar->start != NULL) &&
                   (schema->topgrammar->start->type == XML_RELAXNG_NOOP) &&
                   (schema->topgrammar->start->next != NULL))
                schema->topgrammar->start =
                    schema->topgrammar->start->content;
            xmlRelaxNGCheckRules(ctxt, schema->topgrammar->start,
                                 XML_RELAXNG_IN_START, XML_RELAXNG_NOOP);
        }
    }

    return (schema);
}